

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  int iVar1;
  sqlite3 *db_00;
  WhereTerm *pWVar2;
  WhereTerm *aLast;
  WhereTerm *a;
  sqlite3 *db;
  WhereClause *pWC_local;
  
  db_00 = pWC->pWInfo->pParse->db;
  if (0 < pWC->nTerm) {
    aLast = pWC->a;
    pWVar2 = pWC->a;
    iVar1 = pWC->nTerm;
    while( true ) {
      if ((aLast->wtFlags & 1) != 0) {
        sqlite3ExprDelete(db_00,aLast->pExpr);
      }
      if ((aLast->wtFlags & 0x30) != 0) {
        if ((aLast->wtFlags & 0x10) == 0) {
          whereAndInfoDelete(db_00,(aLast->u).pAndInfo);
        }
        else {
          whereOrInfoDelete(db_00,(aLast->u).pOrInfo);
        }
      }
      if (aLast == pWVar2 + (iVar1 + -1)) break;
      aLast = aLast + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  sqlite3 *db = pWC->pWInfo->pParse->db;
  assert( pWC->nTerm>=pWC->nBase );
  if( pWC->nTerm>0 ){
    WhereTerm *a = pWC->a;
    WhereTerm *aLast = &pWC->a[pWC->nTerm-1];
#ifdef SQLITE_DEBUG
    int i;
    /* Verify that every term past pWC->nBase is virtual */
    for(i=pWC->nBase; i<pWC->nTerm; i++){
      assert( (pWC->a[i].wtFlags & TERM_VIRTUAL)!=0 );
    }
#endif
    while(1){
      assert( a->eMatchOp==0 || a->eOperator==WO_AUX );
      if( a->wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, a->pExpr);
      }
      if( a->wtFlags & (TERM_ORINFO|TERM_ANDINFO) ){
        if( a->wtFlags & TERM_ORINFO ){
          assert( (a->wtFlags & TERM_ANDINFO)==0 );
          whereOrInfoDelete(db, a->u.pOrInfo);
        }else{
          assert( (a->wtFlags & TERM_ANDINFO)!=0 );
          whereAndInfoDelete(db, a->u.pAndInfo);
        }
      }
      if( a==aLast ) break;
      a++;
    }
  }
}